

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O0

Lazy<void>
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::
collect_idle_timeout_client
          (weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
           *self_weak,
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          *clients,milliseconds sleep_time,size_t clear_cnt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  duration<long,_std::ratio<1L,_1000L>_> d;
  bool bVar6;
  memory_order mVar7;
  undefined8 *puVar8;
  LazyPromise<void> *this;
  undefined8 *extraout_RAX;
  null_logger_t *pnVar9;
  element_type *peVar10;
  size_t sVar11;
  YieldAwaiter YVar12;
  long lVar13;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  long *plVar14;
  byte *pbVar15;
  long *plVar16;
  YieldAwaiter *this_00;
  long in_RDX;
  LazyBase<void,_false> in_RDI;
  undefined8 in_R8;
  exception *e;
  shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  memory_order in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  int local_48c;
  int local_354;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  
  puVar8 = (undefined8 *)operator_new(0x128,(nothrow_t *)&std::nothrow);
  if (puVar8 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
  }
  else {
    *puVar8 = collect_idle_timeout_client;
    puVar8[1] = collect_idle_timeout_client;
    plVar14 = puVar8 + 0x11;
    pbVar15 = (byte *)((long)puVar8 + 0x121);
    plVar16 = puVar8 + 0x16;
    this_00 = (YieldAwaiter *)(puVar8 + 0x1f);
    this = (LazyPromise<void> *)(puVar8 + 2);
    std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
    weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *
             )CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *
             )in_stack_fffffffffffffb38);
    *plVar16 = in_RDX;
    puVar8[0x17] = in_RCX;
    puVar8[0x18] = in_R8;
    async_simple::coro::detail::LazyPromise<void>::LazyPromise
              ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    async_simple::coro::detail::LazyPromise<void>::get_return_object
              ((LazyPromise<void> *)in_stack_fffffffffffffb58);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this);
    bVar6 = std::suspend_always::await_ready((suspend_always *)((long)puVar8 + 0x122));
    if (bVar6) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar8 + 0x122));
      std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      lock((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
           CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      bVar6 = std::operator==((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                               *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                              in_stack_fffffffffffffb38);
      if (bVar6) {
        async_simple::coro::detail::LazyPromise<void>::return_void(this);
        local_354 = 3;
      }
      else {
        do {
          detail::
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          ::reselect((client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                      *)0x2ee7ca);
          std::
          shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
          shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                      *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb38);
          std::
          shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
          operator=((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                     *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                    in_stack_fffffffffffffb38);
          std::
          shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
          ~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                       *)0x2ee7fd);
          d.__r._4_4_ = in_stack_fffffffffffffd1c;
          d.__r._0_4_ = in_stack_fffffffffffffd18;
          sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>(d);
          async_simple::coro::detail::LazyPromiseBase::
          await_transform<async_simple::coro::Lazy<void>>
                    ((LazyPromiseBase *)
                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                     (Lazy<void> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
          bVar6 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                            ((LazyAwaiterBase<void> *)(puVar8 + 0x19));
          if (!bVar6) {
            *(undefined1 *)(puVar8 + 0x24) = 1;
            coro_io::client_pool
                      ((void *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                       in_stack_fffffffffffffb58);
            (*(code *)*extraout_RAX)(extraout_RAX);
            return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
          }
          puVar8[0x15] = (LazyAwaiterBase<void> *)(puVar8 + 0x19);
          async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                    ((LazyAwaiterBase<void> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
          async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                    ((ValueAwaiter *)0x2ee993);
          async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x2ee9a0);
          std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
          ::lock((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          std::
          shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
          operator=((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                     *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                    in_stack_fffffffffffffb38);
          bVar6 = std::operator==((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                                   *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                                  in_stack_fffffffffffffb38);
          std::
          shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
          ~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                       *)0x2eea10);
          if (bVar6) break;
          do {
            pnVar9 = cinatra::null_logger_t::operator<<
                               ((null_logger_t *)&cinatra::NULL_LOGGER,
                                (char (*) [38])"start collect timeout client of pool{");
            peVar10 = std::
                      __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2eea60);
            pnVar9 = cinatra::null_logger_t::operator<<(pnVar9,&peVar10->host_name_);
            pnVar9 = cinatra::null_logger_t::operator<<
                               (pnVar9,(char (*) [22])"}, now client count: ");
            sVar11 = detail::
                     client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                     ::size((client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            puVar8[0x1c] = sVar11;
            cinatra::null_logger_t::operator<<(pnVar9,puVar8 + 0x1c);
            sVar11 = detail::
                     client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                     ::clear_old(in_stack_fffffffffffffb58,
                                 CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
            puVar8[0x1d] = sVar11;
            pnVar9 = cinatra::null_logger_t::operator<<
                               ((null_logger_t *)&cinatra::NULL_LOGGER,
                                (char (*) [39])"finish collect timeout client of pool{");
            peVar10 = std::
                      __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2eeb16);
            pnVar9 = cinatra::null_logger_t::operator<<(pnVar9,&peVar10->host_name_);
            pnVar9 = cinatra::null_logger_t::operator<<(pnVar9,(char (*) [20])"}, now client cnt: ")
            ;
            sVar11 = detail::
                     client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                     ::size((client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            puVar8[0x1e] = sVar11;
            cinatra::null_logger_t::operator<<(pnVar9,puVar8 + 0x1e);
            if (puVar8[0x1d] == 0) {
              local_354 = 7;
            }
            else {
              YVar12 = async_simple::coro::detail::LazyPromiseBase::await_transform
                                 ((LazyPromiseBase *)this);
              this_00->_executor = YVar12._executor;
              bVar6 = async_simple::coro::detail::LazyPromiseBase::YieldAwaiter::await_ready
                                (this_00);
              if (!bVar6) {
                *(undefined1 *)(puVar8 + 0x24) = 2;
                coro_io::client_pool
                          ((void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                           (void *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
                return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
              }
              async_simple::coro::detail::LazyPromiseBase::YieldAwaiter::await_resume(this_00);
              local_354 = 0;
            }
          } while (local_354 == 0);
          if (local_354 != 7) goto LAB_002ef6ac;
          std::__atomic_base<unsigned_long>::operator--
                    ((__atomic_base<unsigned_long> *)(*plVar16 + 0x4e8));
          sVar11 = detail::
                   client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                   ::size((client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                           *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
          if (sVar11 == 0) break;
          puVar8[0x21] = 0;
          puVar8[0x12] = *plVar16 + 0x4e8;
          puVar8[0x13] = puVar8 + 0x21;
          puVar8[0x14] = 1;
          *(undefined4 *)(puVar8 + 0x23) = 5;
          lVar13 = puVar8[0x12];
          uVar2 = puVar8[0x13];
          lVar3 = puVar8[0x14];
          uVar1 = *(undefined4 *)(puVar8 + 0x23);
          mVar7 = std::__cmpexch_failure_order(in_stack_fffffffffffffb44);
          puVar8[0xe] = lVar13;
          puVar8[0xf] = uVar2;
          puVar8[0x10] = lVar3;
          *(undefined4 *)(puVar8 + 0x22) = uVar1;
          *(memory_order *)((long)puVar8 + 0x114) = mVar7;
          plVar4 = (long *)puVar8[0xe];
          plVar5 = (long *)puVar8[0xf];
          *plVar14 = puVar8[0x10];
          mVar7 = *(memory_order *)((long)puVar8 + 0x114);
          switch(*(undefined4 *)(puVar8 + 0x22)) {
          case 1:
          case 2:
            if (mVar7 - consume < 2) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else if (mVar7 == seq_cst) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            break;
          case 3:
            if (mVar7 - consume < 2) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else if (mVar7 == seq_cst) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            break;
          case 4:
            if (mVar7 - consume < 2) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else if (mVar7 == seq_cst) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            break;
          case 5:
            if (mVar7 - consume < 2) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else if (mVar7 == seq_cst) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            break;
          default:
            if (mVar7 - consume < 2) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else if (mVar7 == seq_cst) {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
            else {
              lVar3 = *plVar5;
              LOCK();
              lVar13 = *plVar4;
              bVar6 = lVar3 == lVar13;
              if (bVar6) {
                *plVar4 = *plVar14;
                lVar13 = lVar3;
              }
              UNLOCK();
              if (!bVar6) {
                *plVar5 = lVar13;
              }
              *pbVar15 = bVar6;
            }
          }
          if ((*pbVar15 & 1) == 0) {
            local_48c = 5;
          }
          else {
            local_48c = 0;
          }
        } while (local_48c == 0);
        async_simple::coro::detail::LazyPromise<void>::return_void(this);
        local_354 = 3;
      }
LAB_002ef6ac:
      std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      ~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                   *)0x2ef6c4);
      if (local_354 == 3) {
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this);
        bVar6 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar8 + 0x124));
        if (!bVar6) {
          *puVar8 = 0;
          *(undefined1 *)(puVar8 + 0x24) = 3;
          coro_io::client_pool
                    ((void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     (void *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          (*(code *)*extraout_RAX_00)(extraout_RAX_00);
          return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
        }
        async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                  ((FinalAwaiter *)((long)puVar8 + 0x124));
      }
      async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x2ef841);
      std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      ~weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                 *)0x2ef84e);
      if (puVar8 != (undefined8 *)0x0) {
        operator_delete(puVar8,0x128);
      }
    }
    else {
      *(undefined1 *)(puVar8 + 0x24) = 0;
      coro_io::client_pool
                ((void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (void *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    }
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

static async_simple::coro::Lazy<void> collect_idle_timeout_client(
      std::weak_ptr<client_pool> self_weak,
      coro_io::detail::client_queue<std::unique_ptr<client_t>>& clients,
      std::chrono::milliseconds sleep_time, std::size_t clear_cnt) {
    std::shared_ptr<client_pool> self = self_weak.lock();
    if (self == nullptr) {
      co_return;
    }
    while (true) {
      clients.reselect();
      self = nullptr;
      co_await coro_io::sleep_for(sleep_time);
      if ((self = self_weak.lock()) == nullptr) {
        break;
      }
      while (true) {
        CINATRA_LOG_TRACE << "start collect timeout client of pool{"
                          << self->host_name_
                          << "}, now client count: " << clients.size();
        std::size_t is_all_cleared = clients.clear_old(clear_cnt);
        CINATRA_LOG_TRACE << "finish collect timeout client of pool{"
                          << self->host_name_
                          << "}, now client cnt: " << clients.size();
        if (is_all_cleared != 0) [[unlikely]] {
          try {
            co_await async_simple::coro::Yield{};
          } catch (std::exception& e) {
            CINATRA_LOG_ERROR << "unexcepted yield exception: " << e.what();
          }
        }
        else {
          break;
        }
      }
      --clients.collecter_cnt_;
      if (clients.size() == 0) {
        break;
      }
      std::size_t expected = 0;
      if (!clients.collecter_cnt_.compare_exchange_strong(expected, 1))
        break;
    }
    co_return;
  }